

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O0

void __thiscall ON_Workspace::KeepAllMemory(ON_Workspace *this)

{
  ON_Workspace_MBLK *pOVar1;
  ON_Workspace_MBLK *local_20;
  ON_Workspace_MBLK *pNext;
  ON_Workspace_MBLK *p;
  ON_Workspace *this_local;
  
  local_20 = this->m_pMemBlk;
  this->m_pMemBlk = (ON_Workspace_MBLK *)0x0;
  while (local_20 != (ON_Workspace_MBLK *)0x0) {
    pOVar1 = local_20->pNext;
    local_20->pMem = (void *)0x0;
    onfree(local_20);
    local_20 = pOVar1;
  }
  return;
}

Assistant:

void ON_Workspace::KeepAllMemory()
{
  struct ON_Workspace_MBLK* p;
  struct ON_Workspace_MBLK* pNext = m_pMemBlk;
  m_pMemBlk = 0;
  while ( pNext )
  {
    p = pNext;
    pNext = pNext->pNext;
    p->pMem = 0; // caller want to manage this heap
    onfree( p );
  }
}